

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::check_present_values
          (tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  key_view **this_00;
  anon_class_24_3_0ccd3248 fn_00;
  bool bVar1;
  element_type *__range;
  anon_class_24_3_0ccd3248 fn;
  key_view prev;
  undefined8 uStack_70;
  bool first;
  size_t n;
  pointer pbStack_60;
  pause_heap_faults guard;
  key_type local_50;
  value_view *local_40;
  type *value;
  type *key;
  _Self local_28;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *__range3;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  __end1 = std::
           map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ::begin(&this->values);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
       ::end(&this->values);
  while( true ) {
    bVar1 = std::operator==(&__end1,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    key = &std::
           _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           ::operator*(&__end1)->first;
    value = (type *)std::
                    get<0ul,std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>
                              ((pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>
                                *)key);
    local_40 = std::
               get<1ul,std::shared_ptr<std::vector<std::byte,std::allocator<std::byte>>>const,std::span<std::byte_const,18446744073709551615ul>>
                         ((pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>
                           *)key);
    __range = std::
              __shared_ptr_access<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::vector<std::byte,_std::allocator<std::byte>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)value);
    std::span<const_std::byte,_18446744073709551615UL>::
    span<std::vector<std::byte,_std::allocator<std::byte>_>_&>(&local_50,__range);
    pbStack_60 = local_40->_M_ptr;
    detail::
    assert_result_eq<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
              (&this->test_db,local_50,*local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x256);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::operator++(&__end1);
  }
  pause_heap_faults::pause_heap_faults((pause_heap_faults *)((long)&n + 7));
  uStack_70 = 0;
  prev._M_extent._M_extent_value._7_1_ = 1;
  this_00 = &fn.prev;
  std::span<const_std::byte,_18446744073709551615UL>::span
            ((span<const_std::byte,_18446744073709551615UL> *)this_00);
  fn.n = (size_t *)((long)&prev._M_extent._M_extent_value + 7);
  fn_00.first = (bool *)fn.n;
  fn_00.n = &stack0xffffffffffffff90;
  fn_00.prev = (key_view *)this_00;
  fn.first = (bool *)this_00;
  olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
  ::
  scan<unodb::test::tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>::check_present_values()const::_lambda(unodb::visitor<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator>const&)_1_>
            ((olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              *)&this->test_db,fn_00,true);
  pause_heap_faults::~pause_heap_faults((pause_heap_faults *)((long)&n + 7));
  return;
}

Assistant:

void check_present_values() const {
    // Probe the test_db for each key, verifying the expected value is found
    // under that key.
    UNODB_DETAIL_DISABLE_MSVC_WARNING(26445)
    for (const auto &[key, value] : values) {
      if constexpr (std::is_same_v<typename Db::key_type, unodb::key_view>) {
        ASSERT_VALUE_FOR_KEY(Db, test_db, *key, value);
      } else {
        ASSERT_VALUE_FOR_KEY(Db, test_db, key, value);
      }
    }
    UNODB_DETAIL_RESTORE_MSVC_WARNINGS()
    // Scan the test_db.  For each (key,val) visited, verify (a) that each key
    // is visited in lexicographic order; and (b) that each (key,val) pair also
    // appears in the ground truth collection.
    //
    // Note: This depends on the ability to decode the key. Therefore, the
    // caller SHOULD disable this scan when the keys do not support 100%
    // faithful round-trip encoding and decoding.
    UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
    std::size_t n{0};
    bool first = true;
    unodb::key_view prev{};
    auto fn =
        [&n, &first,
         &prev](const unodb::visitor<typename Db::iterator> &visitor) noexcept {
          // We can't tell cheap and expensive to copy types apart in an
          // useful way here
          UNODB_DETAIL_DISABLE_MSVC_WARNING(26445)
          const auto &kv = visitor.get_key();
          UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

          if (UNODB_DETAIL_UNLIKELY(first)) {
            prev = kv;
            first = false;
          } else {
            UNODB_EXPECT_LT(unodb::detail::compare(prev, kv), 0);
            prev = kv;
          }
          n++;
          return false;
        };
    const_cast<Db &>(test_db).scan(fn);
    // FIXME(thompsonbry) variable length keys - enable this assert.
    // 3 OOM tests are failing (for each Db type) when this is enabled
    // (off by one).  What is going on there?
    //
    // const auto sz = values.size();  // #of (key,val) pairs expected.
    // UNODB_EXPECT_EQ(sz, n);
  }